

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *
kj::parse::
Many_<kj::parse::Sequence_<kj::parse::ExactlyConst_<char,_','>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>,_false>
::Impl<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::
apply(Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *__return_storage_ptr__,
     Sequence_<kj::parse::ExactlyConst_<char,__,_>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
     *subParser,ParserInput *input)

{
  char *pcVar1;
  Orphan<capnp::compiler::Token> *pOVar2;
  bool bVar3;
  char *pcVar4;
  Array<capnp::Orphan<capnp::compiler::Token>_> *subResult;
  size_t sVar5;
  Results results;
  NullableValue<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> _subResult425;
  ParserInput subInput;
  Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> local_c8;
  char local_a0;
  Orphan<capnp::compiler::Token> *local_98;
  size_t sStack_90;
  ArrayDisposer *pAStack_88;
  ParserInput local_80;
  Maybe<kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_> *local_58;
  Maybe<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> local_50;
  
  local_c8.builder.ptr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  local_c8.builder.pos = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  local_c8.builder.endPtr = (Array<capnp::Orphan<capnp::compiler::Token>_> *)0x0;
  local_c8.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  local_58 = __return_storage_ptr__;
  do {
    pcVar4 = (input->super_IteratorInput<char,_const_char_*>).pos;
    pcVar1 = (input->super_IteratorInput<char,_const_char_*>).end;
    if (pcVar4 == pcVar1) break;
    local_80.begin = input->begin;
    local_80.super_IteratorInput<char,_const_char_*>.parent =
         &input->super_IteratorInput<char,_const_char_*>;
    local_80.super_IteratorInput<char,_const_char_*>.pos = pcVar4;
    local_80.super_IteratorInput<char,_const_char_*>.end = pcVar1;
    local_80.super_IteratorInput<char,_const_char_*>.best = pcVar4;
    Sequence_<kj::parse::ExactlyConst_<char,_','>,_kj::parse::ParserRef<capnp::compiler::Lexer::ParserInput,_kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>_&>
    ::parseNext<capnp::compiler::Lexer::ParserInput>(&local_50,subParser,&local_80);
    bVar3 = local_50.ptr.isSet;
    local_a0 = local_50.ptr.isSet;
    if (local_50.ptr.isSet == true) {
      local_98 = local_50.ptr.field_1.value.ptr;
      sStack_90 = local_50.ptr.field_1.value.size_;
      pAStack_88 = local_50.ptr.field_1.value.disposer;
      local_50.ptr.field_1.value.ptr = (Orphan<capnp::compiler::Token> *)0x0;
      local_50.ptr.field_1.value.size_ = 0;
      ((IteratorInput<char,_const_char_*> *)
      &(local_80.super_IteratorInput<char,_const_char_*>.parent)->parent)->pos =
           local_80.super_IteratorInput<char,_const_char_*>.pos;
      if (local_c8.builder.pos == local_c8.builder.endPtr) {
        sVar5 = ((long)local_c8.builder.endPtr - (long)local_c8.builder.ptr >> 3) *
                0x5555555555555556;
        if (local_c8.builder.endPtr == local_c8.builder.ptr) {
          sVar5 = 4;
        }
        Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::setCapacity(&local_c8,sVar5);
      }
      (local_c8.builder.pos)->ptr = local_98;
      (local_c8.builder.pos)->size_ = sStack_90;
      (local_c8.builder.pos)->disposer = pAStack_88;
      local_98 = (Orphan<capnp::compiler::Token> *)0x0;
      sStack_90 = 0;
      local_c8.builder.pos = local_c8.builder.pos + 1;
    }
    sVar5 = sStack_90;
    pOVar2 = local_98;
    if ((local_a0 == '\x01') && (local_98 != (Orphan<capnp::compiler::Token> *)0x0)) {
      local_98 = (Orphan<capnp::compiler::Token> *)0x0;
      sStack_90 = 0;
      (**pAStack_88->_vptr_ArrayDisposer)
                (pAStack_88,pOVar2,0x20,sVar5,sVar5,
                 ArrayDisposer::Dispose_<capnp::Orphan<capnp::compiler::Token>_>::destruct);
    }
    if ((ParserInput *)local_80.super_IteratorInput<char,_const_char_*>.parent != (ParserInput *)0x0
       ) {
      pcVar4 = local_80.super_IteratorInput<char,_const_char_*>.best;
      if (local_80.super_IteratorInput<char,_const_char_*>.best <
          local_80.super_IteratorInput<char,_const_char_*>.pos) {
        pcVar4 = local_80.super_IteratorInput<char,_const_char_*>.pos;
      }
      pcVar1 = ((IteratorInput<char,_const_char_*> *)
               &(local_80.super_IteratorInput<char,_const_char_*>.parent)->parent)->best;
      if (pcVar4 <= pcVar1) {
        pcVar4 = pcVar1;
      }
      ((IteratorInput<char,_const_char_*> *)
      &(local_80.super_IteratorInput<char,_const_char_*>.parent)->parent)->best = pcVar4;
    }
  } while (bVar3 != false);
  if (local_c8.builder.pos != local_c8.builder.endPtr) {
    Vector<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::setCapacity
              (&local_c8,
               ((long)local_c8.builder.pos - (long)local_c8.builder.ptr >> 3) * -0x5555555555555555)
    ;
  }
  (local_58->ptr).isSet = true;
  (local_58->ptr).field_1.value.ptr = local_c8.builder.ptr;
  (local_58->ptr).field_1.value.size_ =
       ((long)local_c8.builder.pos - (long)local_c8.builder.ptr >> 3) * -0x5555555555555555;
  (local_58->ptr).field_1.value.disposer = local_c8.builder.disposer;
  return local_58;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }